

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

double dist(Vector3d a,Vector3d b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  Matrix<double,_3,_1> local_30;
  Matrix<double,_3,_1> local_20;
  
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_20,0,0);
  dVar1 = *pdVar6;
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_30,0,0);
  dVar2 = *pdVar6;
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_20,1,0);
  dVar3 = *pdVar6;
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_30,1,0);
  dVar4 = *pdVar6;
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_20,2,0);
  dVar5 = *pdVar6;
  pdVar6 = Matrix<double,_3,_1>::operator()(&local_30,2,0);
  return SQRT((dVar5 - *pdVar6) * (dVar5 - *pdVar6) +
              (dVar3 - dVar4) * (dVar3 - dVar4) + (dVar1 - dVar2) * (dVar1 - dVar2));
}

Assistant:

double dist(const Vector3d a, const Vector3d b)
{
    double X2 = pow((a(0, 0) - b(0, 0)), 2);
    double Y2 = pow((a(1, 0) - b(1, 0)), 2);
    double Z2 = pow((a(2, 0) - b(2, 0)), 2);
    return (sqrt(X2 + Y2 + Z2));
}